

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O3

int hkdf_expand_label(ptls_hash_algorithm_t *algo,void *output,size_t outlen,ptls_iovec_t secret,
                     char *label,ptls_iovec_t hash_value,char *label_prefix)

{
  ptls_iovec_t info;
  ptls_iovec_t prk;
  size_t sVar1;
  int iVar2;
  size_t sVar3;
  uint8_t *puVar4;
  size_t sVar5;
  char cVar6;
  size_t sVar7;
  uint8_t hkdf_label_buf [80];
  ptls_buffer_t local_d8;
  ptls_hash_algorithm_t *local_b8;
  void *local_b0;
  uint8_t *local_a8;
  size_t local_a0;
  uint8_t *local_98;
  size_t sStack_90;
  uint8_t local_88 [88];
  
  local_a0 = secret.len;
  local_a8 = secret.base;
  local_b8 = algo;
  local_b0 = output;
  if (label_prefix == (char *)0x0) {
    __assert_fail("label_prefix != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/deps/picotls/lib/picotls.c"
                  ,0x1431,
                  "int hkdf_expand_label(ptls_hash_algorithm_t *, void *, size_t, ptls_iovec_t, const char *, ptls_iovec_t, const char *)"
                 );
  }
  local_d8.base = local_88;
  local_d8.off = 0;
  local_d8.capacity = 0x50;
  local_d8.is_allocated = 0;
  iVar2 = ptls_buffer_reserve(&local_d8,2);
  puVar4 = local_d8.base;
  sVar7 = local_d8.off;
  if (iVar2 == 0) {
    *(ushort *)(local_d8.base + local_d8.off) = (ushort)outlen << 8 | (ushort)outlen >> 8;
    local_d8.off = local_d8.off + 2;
    iVar2 = ptls_buffer_reserve(&local_d8,1);
    sVar1 = local_d8.off;
    puVar4 = local_d8.base;
    sVar7 = local_d8.off;
    if (iVar2 == 0) {
      local_d8.base[local_d8.off] = '\0';
      sVar5 = local_d8.off + 1;
      local_d8.off = sVar5;
      sVar3 = strlen(label_prefix);
      sVar7 = sVar5;
      if (sVar3 != 0) {
        iVar2 = ptls_buffer_reserve(&local_d8,sVar3);
        sVar7 = local_d8.off;
        puVar4 = local_d8.base;
        if (iVar2 != 0) goto LAB_0010c3a5;
        memcpy(local_d8.base + local_d8.off,label_prefix,sVar3);
        sVar7 = sVar3 + sVar7;
        local_d8.off = sVar7;
      }
      cVar6 = (char)sVar7;
      sVar3 = strlen(label);
      if (sVar3 != 0) {
        iVar2 = ptls_buffer_reserve(&local_d8,sVar3);
        sVar7 = local_d8.off;
        puVar4 = local_d8.base;
        if (iVar2 != 0) goto LAB_0010c3a5;
        memcpy(local_d8.base + local_d8.off,label,sVar3);
        local_d8.off = sVar3 + sVar7;
        cVar6 = (char)local_d8.off;
      }
      puVar4[sVar1] = cVar6 - (char)sVar5;
      iVar2 = ptls_buffer_reserve(&local_d8,1);
      sVar1 = local_d8.off;
      puVar4 = local_d8.base;
      sVar7 = local_d8.off;
      if (iVar2 == 0) {
        local_d8.base[local_d8.off] = '\0';
        sVar5 = local_d8.off + 1;
        sVar7 = sVar5;
        if (hash_value.len != 0) {
          local_d8.off = sVar5;
          iVar2 = ptls_buffer_reserve(&local_d8,hash_value.len);
          sVar7 = local_d8.off;
          puVar4 = local_d8.base;
          if (iVar2 != 0) goto LAB_0010c3a5;
          memcpy(local_d8.base + local_d8.off,hash_value.base,hash_value.len);
          sVar7 = sVar7 + hash_value.len;
        }
        puVar4[sVar1] = (char)sVar7 - (char)sVar5;
        prk.len = local_a0;
        prk.base = local_a8;
        info.len = sVar7;
        info.base = puVar4;
        local_d8.off = sVar7;
        local_98 = puVar4;
        sStack_90 = sVar7;
        iVar2 = ptls_hkdf_expand(local_b8,local_b0,outlen,prk,info);
      }
    }
  }
LAB_0010c3a5:
  (*ptls_clear_memory)(puVar4,sVar7);
  if (local_d8.is_allocated != 0) {
    free(puVar4);
  }
  return iVar2;
}

Assistant:

int hkdf_expand_label(ptls_hash_algorithm_t *algo, void *output, size_t outlen, ptls_iovec_t secret, const char *label,
                      ptls_iovec_t hash_value, const char *label_prefix)
{
    ptls_buffer_t hkdf_label;
    uint8_t hkdf_label_buf[80];
    int ret;

    assert(label_prefix != NULL);

    ptls_buffer_init(&hkdf_label, hkdf_label_buf, sizeof(hkdf_label_buf));

    ptls_buffer_push16(&hkdf_label, (uint16_t)outlen);
    ptls_buffer_push_block(&hkdf_label, 1, {
        ptls_buffer_pushv(&hkdf_label, label_prefix, strlen(label_prefix));
        ptls_buffer_pushv(&hkdf_label, label, strlen(label));
    });
    ptls_buffer_push_block(&hkdf_label, 1, { ptls_buffer_pushv(&hkdf_label, hash_value.base, hash_value.len); });

    ret = ptls_hkdf_expand(algo, output, outlen, secret, ptls_iovec_init(hkdf_label.base, hkdf_label.off));

Exit:
    ptls_buffer_dispose(&hkdf_label);
    return ret;
}